

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

void sptk::world::cftfx41(int n,double *a,int nw,double *w)

{
  double *w_00;
  
  w_00 = w + (long)nw + -8;
  if (n == 0x80) {
    cftf161(a,w_00);
    cftf162(a + 0x20,w + (long)nw + -0x20);
    cftf161(a + 0x40,w_00);
    cftf161(a + 0x60,w_00);
    return;
  }
  cftf081(a,w_00);
  cftf082(a + 0x10,w_00);
  cftf081(a + 0x20,w_00);
  cftf081(a + 0x30,w_00);
  return;
}

Assistant:

void cftfx41(int n, double *a, int nw, double *w) {
#if 0
  void cftf161(double *a, double *w);
  void cftf162(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftf082(double *a, double *w);
#endif

  if (n == 128) {
    cftf161(a, &w[nw - 8]);
    cftf162(&a[32], &w[nw - 32]);
    cftf161(&a[64], &w[nw - 8]);
    cftf161(&a[96], &w[nw - 8]);
  } else {
    cftf081(a, &w[nw - 8]);
    cftf082(&a[16], &w[nw - 8]);
    cftf081(&a[32], &w[nw - 8]);
    cftf081(&a[48], &w[nw - 8]);
  }
}